

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScalarValidator.cpp
# Opt level: O2

Result * CoreML::validate<(MLModelType)604>(Result *__return_storage_ptr__,Model *format)

{
  bool bVar1;
  Type *pTVar2;
  Type *pTVar3;
  int64_t iVar4;
  int64_t iVar5;
  ulong uVar6;
  uint32_t uVar7;
  undefined1 *puVar8;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  undefined1 *puVar9;
  ulong uVar10;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  allocator_type local_a9;
  undefined1 local_a8 [40];
  _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_80;
  Result result;
  TypeCase local_3c [3];
  
  puVar9 = (undefined1 *)format->description_;
  if ((ModelDescription *)puVar9 == (ModelDescription *)0x0) {
    puVar9 = Specification::_ModelDescription_default_instance_;
  }
  Result::Result(&result);
  local_80._M_impl.super__Vector_impl_data._M_start._0_1_ = false;
  local_80._M_impl.super__Vector_impl_data._M_start._1_1_ = false;
  local_80._M_impl.super__Vector_impl_data._M_start._2_1_ = false;
  local_80._M_impl.super__Vector_impl_data._M_start._3_1_ = false;
  validateModelDescription
            ((Result *)local_a8,(ModelDescription *)puVar9,format->specificationversion_,
             (ValidationPolicy *)&local_80);
  Result::operator=(&result,(Result *)local_a8);
  std::__cxx11::string::~string((string *)(local_a8 + 8));
  bVar1 = Result::good(&result);
  if (bVar1) {
    local_3c[0] = kInt64Type;
    local_3c[1] = kDoubleType;
    local_3c[2] = 5;
    __l._M_len = 3;
    __l._M_array = local_3c;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              *)&local_80,__l,&local_a9);
    validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)local_a8,(CoreML *)&((ModelDescription *)puVar9)->input_,
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_80,
               in_R8);
    Result::operator=(&result,(Result *)local_a8);
    std::__cxx11::string::~string((string *)(local_a8 + 8));
    std::
    _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~_Vector_base(&local_80);
    bVar1 = Result::good(&result);
    if (bVar1) {
      local_3c[0] = kInt64Type;
      local_3c[1] = kDoubleType;
      local_3c[2] = 5;
      __l_00._M_len = 3;
      __l_00._M_array = local_3c;
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                *)&local_80,__l_00,&local_a9);
      validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                ((Result *)local_a8,(CoreML *)&((ModelDescription *)puVar9)->output_,
                 (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_80,
                 in_R8);
      Result::operator=(&result,(Result *)local_a8);
      std::__cxx11::string::~string((string *)(local_a8 + 8));
      std::
      _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::~_Vector_base(&local_80);
      bVar1 = Result::good(&result);
      if (bVar1) {
        pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                           (&(((ModelDescription *)puVar9)->input_).super_RepeatedPtrFieldBase,0);
        pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                           (&(((ModelDescription *)puVar9)->output_).super_RepeatedPtrFieldBase,0);
        puVar9 = (undefined1 *)pTVar2->type_;
        if ((FeatureType *)puVar9 == (FeatureType *)0x0) {
          puVar9 = Specification::_FeatureType_default_instance_;
        }
        uVar7 = ((FeatureType *)puVar9)->_oneof_case_[0];
        puVar8 = (undefined1 *)pTVar3->type_;
        if ((FeatureType *)puVar8 == (FeatureType *)0x0) {
          puVar8 = Specification::_FeatureType_default_instance_;
        }
        if (uVar7 == 1) {
          if (((FeatureType *)puVar8)->_oneof_case_[0] - 1 < 2) {
LAB_00285eff:
            if (format->_oneof_case_[0] == 0x25c) {
              puVar9 = (undefined1 *)(format->Type_).textclassifier_;
            }
            else {
              puVar9 = Specification::_Scaler_default_instance_;
            }
            if (*(uint *)&(((TextClassifier *)puVar9)->language_).tagged_ptr_.ptr_ < 2) {
              if (((TextClassifier *)puVar9)->revision_ < 2) goto LAB_00285f4d;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_a8,
                         "For input type array, specified scale values must be empty or a scalar.",
                         (allocator<char> *)&local_80);
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_a8);
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_a8,
                         "For a scalar imput type, specified shift value must be empty or a scalar."
                         ,(allocator<char> *)&local_80);
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_a8);
            }
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_a8,"Input type Int64 must output to Int64 or Double.",
                       (allocator<char> *)&local_80);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_a8);
          }
        }
        else if (((FeatureType *)puVar8)->_oneof_case_[0] == uVar7) {
          if (uVar7 != 5) goto LAB_00285eff;
          if ((((((FeatureType *)puVar9)->Type_).multiarraytype_)->shape_).current_size_ == 1) {
            if ((((((FeatureType *)puVar8)->Type_).multiarraytype_)->shape_).current_size_ == 1) {
              iVar4 = Specification::ArrayFeatureType::_internal_shape
                                ((((FeatureType *)puVar9)->Type_).multiarraytype_,0);
              puVar9 = (undefined1 *)pTVar3->type_;
              if ((FeatureType *)puVar9 == (FeatureType *)0x0) {
                puVar9 = Specification::_FeatureType_default_instance_;
              }
              if (((FeatureType *)puVar9)->_oneof_case_[0] == 5) {
                puVar9 = (undefined1 *)(((FeatureType *)puVar9)->Type_).multiarraytype_;
              }
              else {
                puVar9 = Specification::_ArrayFeatureType_default_instance_;
              }
              iVar5 = Specification::ArrayFeatureType::_internal_shape((ArrayFeatureType *)puVar9,0)
              ;
              if (iVar4 == iVar5) {
                uVar7 = format->_oneof_case_[0];
                puVar9 = (undefined1 *)(format->Type_).supportvectorclassifier_;
                puVar8 = puVar9;
                if (uVar7 != 0x25c) {
                  puVar8 = Specification::_Scaler_default_instance_;
                }
                uVar10 = (ulong)(((SupportVectorClassifier *)puVar8)->
                                numberofsupportvectorsperclass_).current_size_;
                if (1 < uVar10) {
                  puVar9 = (undefined1 *)pTVar2->type_;
                  if ((FeatureType *)puVar9 == (FeatureType *)0x0) {
                    puVar9 = Specification::_FeatureType_default_instance_;
                  }
                  if (((FeatureType *)puVar9)->_oneof_case_[0] == 5) {
                    puVar9 = (undefined1 *)(((FeatureType *)puVar9)->Type_).multiarraytype_;
                  }
                  else {
                    puVar9 = Specification::_ArrayFeatureType_default_instance_;
                  }
                  uVar6 = Specification::ArrayFeatureType::_internal_shape
                                    ((ArrayFeatureType *)puVar9,0);
                  if (uVar6 != uVar10) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)local_a8,
                               "For input type array, specified shift values must be empty, a scalar, or a vector of the matching length."
                               ,(allocator<char> *)&local_80);
                    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                                   (string *)local_a8);
                    goto LAB_0028606d;
                  }
                  uVar7 = format->_oneof_case_[0];
                  puVar9 = (undefined1 *)(format->Type_).scaler_;
                }
                if (uVar7 != 0x25c) {
                  puVar9 = Specification::_Scaler_default_instance_;
                }
                uVar10 = (ulong)(((SupportVectorClassifier *)puVar9)->
                                _numberofsupportvectorsperclass_cached_byte_size_).
                                super___atomic_base<int>._M_i;
                if (1 < uVar10) {
                  puVar9 = (undefined1 *)pTVar2->type_;
                  if ((FeatureType *)puVar9 == (FeatureType *)0x0) {
                    puVar9 = Specification::_FeatureType_default_instance_;
                  }
                  if (((FeatureType *)puVar9)->_oneof_case_[0] == 5) {
                    puVar9 = (undefined1 *)(((FeatureType *)puVar9)->Type_).multiarraytype_;
                  }
                  else {
                    puVar9 = Specification::_ArrayFeatureType_default_instance_;
                  }
                  uVar6 = Specification::ArrayFeatureType::_internal_shape
                                    ((ArrayFeatureType *)puVar9,0);
                  if (uVar6 != uVar10) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)local_a8,
                               "For input type array, specified scale values must be empty, a scalar, or a vector of the matching length."
                               ,(allocator<char> *)&local_80);
                    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                                   (string *)local_a8);
                    goto LAB_0028606d;
                  }
                }
                goto LAB_00285f4d;
              }
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_a8,
                       "Shape of output array does not match shape of input array.",
                       (allocator<char> *)&local_80);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_a8);
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_a8,
                       "Only 1 dimensional arrays input features are supported by the scaler.",
                       (allocator<char> *)&local_80);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_a8);
          }
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_a8,
                     "Type of input feature does not match the output type feature.",
                     (allocator<char> *)&local_80);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_a8);
        }
LAB_0028606d:
        std::__cxx11::string::~string((string *)local_a8);
        goto LAB_00285f5a;
      }
    }
  }
LAB_00285f4d:
  Result::Result(__return_storage_ptr__,&result);
LAB_00285f5a:
  std::__cxx11::string::~string((string *)&result.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_scaler>(const Specification::Model& format) {
        const auto& description = format.description();

            // Convenience typedefs
        typedef Specification::FeatureType FT;
        typedef Specification::Imputer::ReplaceValueCase RVC;

        Result result;

        // Validate its a MLModel type.
        result = validateModelDescription(description, format.specificationversion());
        if (!result.good()) {
            return result;
        }

        // Validate the inputs
        result = validateDescriptionsContainFeatureWithTypes(description.input(), 1,
        {FT::kInt64Type, FT::kDoubleType, FT::kMultiArrayType});

        if (!result.good()) {
            return result;
        }

        // Validate the outputs
        result = validateDescriptionsContainFeatureWithTypes(description.output(), 1,
        {FT::kInt64Type, FT::kDoubleType, FT::kMultiArrayType});

        if (!result.good()) {
            return result;
        }

        // Make sure the input and output type match.
        // From the above, we know that we have exactly one input and one output type.
        const auto& input = description.input()[0];
        const auto& output = description.output()[0];

        if(input.type().Type_case() == FT::kInt64Type) {
            if((output.type().Type_case() != FT::kInt64Type)
               && (output.type().Type_case() != FT::kDoubleType)) {

                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "Input type Int64 must output to Int64 or Double.");
            }
        } else if(output.type().Type_case() != input.type().Type_case()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "Type of input feature does not match the output type feature.");
        }

            // If it's an array, we need to test sizes.
        if(input.type().Type_case() == FT::kMultiArrayType) {
            if(input.type().multiarraytype().shape_size() != 1) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "Only 1 dimensional arrays input features are supported by the scaler.");
            }

            if(output.type().multiarraytype().shape_size() != 1
               || (input.type().multiarraytype().shape(0) != output.type().multiarraytype().shape(0))) {
                return  Result(ResultType::INVALID_MODEL_PARAMETERS,
                               "Shape of output array does not match shape of input array.");
            }

            // Now, make sure that the repeated values make sense.
            int64_t shift_size = static_cast<int64_t>(format.scaler().shiftvalue_size());

            if(!(shift_size == 0 || shift_size == 1
                 || shift_size == input.type().multiarraytype().shape(0))) {

                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "For input type array, specified shift values must be empty, a scalar, or a vector of the matching length.");
            }

                // Now, make sure that the repeated values make sense.
            int64_t scale_size = static_cast<int64_t>(format.scaler().scalevalue_size());

            if(!(scale_size == 0 || scale_size == 1
                 || scale_size == input.type().multiarraytype().shape(0))) {

                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "For input type array, specified scale values must be empty, a scalar, or a vector of the matching length.");
            }
        } else {
                // Now, make sure that the repeated values make sense.
            size_t shift_size = static_cast<size_t>(format.scaler().shiftvalue_size());

            if(!(shift_size == 0 || shift_size == 1)) {

                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "For a scalar imput type, specified shift value must be empty or a scalar.");
            }

                // Now, make sure that the repeated values make sense.
            size_t scale_size = static_cast<size_t>(format.scaler().scalevalue_size());

            if(!(scale_size == 0 || scale_size == 1)) {

                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "For input type array, specified scale values must be empty or a scalar.");
            }
        }

        return result;
    }